

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register.cpp
# Opt level: O1

optional<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
* __thiscall
bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetByEdition
          (optional<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
           *__return_storage_ptr__,SubjectSetRegister *this,uint32_t edition)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> local_30;
  
  local_30._M_owns = false;
  local_30._M_device = &this->mutex_;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  RemoveEditionsOlderThan(this,edition);
  p_Var3 = &(this->subject_set_cache_)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (this->subject_set_cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &p_Var3->_M_header;
  for (; p_Var2 != (_Base_ptr)0x0;
      p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < (int)edition]) {
    if ((int)edition <= (int)p_Var2[1]._M_color) {
      p_Var1 = p_Var2;
    }
  }
  p_Var2 = &p_Var3->_M_header;
  if (((_Rb_tree_header *)p_Var1 != p_Var3) &&
     (p_Var2 = p_Var1, (int)edition < (int)p_Var1[1]._M_color)) {
    p_Var2 = &p_Var3->_M_header;
  }
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    std::
    vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
    ::vector((vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
              *)__return_storage_ptr__,
             (vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
              *)p_Var2[1]._M_parent);
  }
  (__return_storage_ptr__->
  super__Optional_base<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>_>
  ._M_engaged = (_Rb_tree_header *)p_Var2 != p_Var3;
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::vector<Subject>> SubjectSetRegister::SubjectSetByEdition(uint32_t edition)
{
    std::unique_lock<std::mutex> lck(mutex_);

    RemoveEditionsOlderThan(edition);

    auto edition_data = subject_set_cache_.find(edition);
    if (edition_data == subject_set_cache_.end())
    {
        return {};
    }

    return edition_data->second->GetSubjects();
}